

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cpp
# Opt level: O0

IdSet * jsonnet::internal::static_analysis(AST *ast_,bool in_object,IdSet *vars)

{
  byte bVar1;
  bool bVar2;
  reference ppAVar3;
  undefined8 uVar4;
  long lVar5;
  StaticError *this;
  ostream *this_00;
  void *this_01;
  undefined8 in_RCX;
  byte in_DL;
  void *in_RSI;
  IdSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>,_bool> pVar6;
  Identifier *id;
  iterator __end2;
  iterator __begin2;
  IdSet *__range2;
  Var *ast_13;
  Unary *ast_12;
  SuperIndex *ast_11;
  IdSet new_vars_2;
  ObjectComprehensionSimple *ast_10;
  AST *assert;
  iterator __end3_9;
  iterator __begin3_9;
  ASTs *__range3_9;
  Field *field;
  iterator __end3_8;
  iterator __begin3_8;
  Fields *__range3_8;
  DesugaredObject *ast_9;
  Bind *bind_2;
  const_iterator __end3_7;
  const_iterator __begin3_7;
  Binds *__range3_7;
  Bind *bind_1;
  const_iterator __end3_6;
  const_iterator __begin3_6;
  Binds *__range3_6;
  IdSet fvs;
  IdSet new_vars_1;
  Bind *bind;
  const_iterator __end3_5;
  const_iterator __begin3_5;
  Binds *__range3_5;
  IdSet ast_vars;
  Local *ast_8;
  Index *ast_7;
  InSuper *ast_6;
  ArgParam *p_2;
  iterator __end3_4;
  iterator __begin3_4;
  ArgParams *__range3_4;
  ArgParam *p_1;
  iterator __end3_3;
  iterator __begin3_3;
  ArgParams *__range3_3;
  IdSet fv;
  string msg;
  ArgParam *p;
  iterator __end3_2;
  iterator __begin3_2;
  ArgParams *__range3_2;
  IdSet params;
  IdSet new_vars;
  Function *ast_5;
  Error *ast_4;
  Conditional *ast_3;
  Binary *ast_2;
  Element *el;
  iterator __end3_1;
  iterator __begin3_1;
  Elements *__range3_1;
  Array *ast_1;
  ArgParam *arg;
  iterator __end3;
  iterator __begin3;
  ArgParams *__range3;
  Apply *ast;
  IdSet *r;
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  *in_stack_fffffffffffff478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff480;
  IdSet *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  LocationRange *in_stack_fffffffffffff498;
  StaticError *in_stack_fffffffffffff4a0;
  allocator<char> *in_stack_fffffffffffff4b0;
  char *in_stack_fffffffffffff4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4c0;
  long local_b38;
  long local_b10;
  long local_ae8;
  long local_ac8;
  long local_ab8;
  long local_aa8;
  long local_a98;
  long local_a88;
  long local_a78;
  long local_a58;
  long local_a48;
  long local_a20;
  long local_a10;
  long local_a00;
  long local_9f0;
  long local_9b0;
  long local_9a0;
  long local_990;
  long local_980;
  long local_970;
  long local_960;
  long local_950;
  long local_940;
  _Self local_910;
  _Self local_908 [2];
  _Base_ptr local_8f8;
  undefined1 local_8f0;
  undefined1 local_8e1;
  _Self local_8a0;
  _Self local_898 [15];
  undefined1 local_81a;
  undefined1 local_7ea;
  _Base_ptr local_738;
  undefined1 local_730;
  AST *local_6c0;
  _Self local_6b8;
  _Self local_6b0;
  long local_6a8;
  reference local_640;
  Field *local_638;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  local_630;
  long local_628;
  void *local_620;
  reference local_618;
  Bind *local_610;
  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
  local_608;
  long local_600;
  reference local_598;
  Bind *local_590;
  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
  local_588;
  long local_580;
  _Base_ptr local_518;
  undefined1 local_510;
  reference local_508;
  Bind *local_500;
  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
  local_4f8;
  long local_4f0;
  void *local_4b8;
  undefined1 local_412;
  reference local_3e8;
  ArgParam *local_3e0;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_3d8;
  long local_3d0;
  reference local_398;
  ArgParam *local_390;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_388;
  long local_380;
  _Base_ptr local_348;
  undefined1 local_340;
  _Base_ptr local_338;
  undefined1 local_330;
  string local_328 [64];
  _Self local_2e8;
  _Self local_2e0;
  reference local_2d8;
  ArgParam *local_2d0;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_2c8;
  long local_2c0;
  void *local_258;
  reference local_e8;
  Element *local_e0;
  __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
  local_d8;
  long local_d0;
  reference local_90;
  ArgParam *local_88;
  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
  local_80;
  long local_78;
  void *local_30;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar7;
  undefined1 in_object_00;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  uVar7 = 0;
  std::
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         *)0x2bbdda);
  in_object_00 = (undefined1)((ulong)in_RCX >> 0x38);
  switch(*(undefined4 *)((long)in_RSI + 0x48)) {
  case 0:
    if (in_RSI == (void *)0x0) {
      local_940 = 0;
    }
    else {
      local_940 = __dynamic_cast(in_RSI,&AST::typeinfo,&Apply::typeinfo,0);
    }
    if (local_940 == 0) {
      __assert_fail("dynamic_cast<Apply *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x2e,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_30 = in_RSI;
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),SUB81((ulong)in_RCX >> 0x38,0),
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bbeee);
    local_78 = (long)local_30 + 0xa0;
    local_80._M_current =
         (ArgParam *)
         std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
         begin((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               in_stack_fffffffffffff478);
    local_88 = (ArgParam *)
               std::
               vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
               end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                    *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_90 = __gnu_cxx::
                 __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                 ::operator*(&local_80);
      static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                      SUB81((ulong)in_RCX >> 0x38,0),
                      (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
      append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x2bbfb3);
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
      ::operator++(&local_80);
    }
    break;
  case 1:
    if (in_RSI == (void *)0x0) {
      local_950 = 0;
    }
    else {
      local_950 = __dynamic_cast(in_RSI,&AST::typeinfo,&ApplyBrace::typeinfo,0);
    }
    if (local_950 == 0) {
      __assert_fail("dynamic_cast<ApplyBrace *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x35,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 2:
    if (in_RSI == (void *)0x0) {
      local_960 = 0;
    }
    else {
      local_960 = __dynamic_cast(in_RSI,&AST::typeinfo,&Array::typeinfo,0);
    }
    if (local_960 == 0) {
      __assert_fail("dynamic_cast<Array *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x39,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_d0 = (long)in_RSI + 0x80;
    local_d8._M_current =
         (Element *)
         std::
         vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
         ::begin((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                  *)in_stack_fffffffffffff478);
    local_e0 = (Element *)
               std::
               vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
               ::end((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                      *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_e8 = __gnu_cxx::
                 __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
                 ::operator*(&local_d8);
      static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                      SUB81((ulong)in_RCX >> 0x38,0),
                      (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
      append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x2bc1fc);
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::Array::Element_*,_std::vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>_>
      ::operator++(&local_d8);
    }
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
    this_01 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    abort();
  case 6:
    if (in_RSI == (void *)0x0) {
      local_970 = 0;
    }
    else {
      local_970 = __dynamic_cast(in_RSI,&AST::typeinfo,&Binary::typeinfo,0);
    }
    if (local_970 == 0) {
      __assert_fail("dynamic_cast<Binary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x3f,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bc318);
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bc36d);
    break;
  case 7:
    if (in_RSI == (void *)0x0) {
      local_980 = 0;
    }
    else {
      local_980 = __dynamic_cast(in_RSI,&AST::typeinfo,&BuiltinFunction::typeinfo,0);
    }
    if (local_980 == 0) {
      __assert_fail("dynamic_cast<BuiltinFunction *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x45,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 8:
    if (in_RSI == (void *)0x0) {
      local_990 = 0;
    }
    else {
      local_990 = __dynamic_cast(in_RSI,&AST::typeinfo,&Conditional::typeinfo,0);
    }
    if (local_990 == 0) {
      __assert_fail("dynamic_cast<Conditional *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x49,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bc51c);
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bc571);
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bc5c6);
    break;
  case 9:
    if (in_RSI == (void *)0x0) {
      local_ab8 = 0;
    }
    else {
      local_ab8 = __dynamic_cast(in_RSI,&AST::typeinfo,&DesugaredObject::typeinfo,0);
    }
    if (local_ab8 == 0) {
      __assert_fail("dynamic_cast<DesugaredObject *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xaa,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_628 = (long)in_RSI + 0x98;
    local_620 = in_RSI;
    local_630._M_current =
         (Field *)std::
                  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                  ::begin((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                           *)in_stack_fffffffffffff478);
    local_638 = (Field *)std::
                         vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                         ::end((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                                *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_640 = __gnu_cxx::
                  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                  ::operator*(&local_630);
      static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                      SUB81((ulong)in_RCX >> 0x38,0),
                      (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
      append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x2bd9d3);
      static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                      SUB81((ulong)in_RCX >> 0x38,0),
                      (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
      append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x2bda1f);
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
      ::operator++(&local_630);
    }
    local_6a8 = (long)local_620 + 0x80;
    local_6b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
         begin((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
               in_stack_fffffffffffff478);
    local_6b8._M_node =
         (_List_node_base *)
         std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
         end((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
             in_stack_fffffffffffff478);
    while (bVar2 = std::operator!=(&local_6b0,&local_6b8), bVar2) {
      ppAVar3 = std::_List_iterator<jsonnet::internal::AST_*>::operator*
                          ((_List_iterator<jsonnet::internal::AST_*> *)in_stack_fffffffffffff480);
      local_6c0 = *ppAVar3;
      static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                      SUB81((ulong)in_RCX >> 0x38,0),
                      (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
      append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x2bdb3b);
      std::_List_iterator<jsonnet::internal::AST_*>::operator++(&local_6b0);
    }
    break;
  case 0xb:
    if (in_RSI == (void *)0x0) {
      local_9a0 = 0;
    }
    else {
      local_9a0 = __dynamic_cast(in_RSI,&AST::typeinfo,&Error::typeinfo,0);
    }
    if (local_9a0 == 0) {
      __assert_fail("dynamic_cast<Error *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x50,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bc71c);
    break;
  case 0xc:
    if (in_RSI == (void *)0x0) {
      local_9b0 = 0;
    }
    else {
      local_9b0 = __dynamic_cast(in_RSI,&AST::typeinfo,&Function::typeinfo,0);
    }
    if (local_9b0 == 0) {
      __assert_fail("dynamic_cast<Function *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x55,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_258 = in_RSI;
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           *)0x2bc7f5);
    local_2c0 = (long)local_258 + 0x98;
    local_2c8._M_current =
         (ArgParam *)
         std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
         begin((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               in_stack_fffffffffffff478);
    local_2d0 = (ArgParam *)
                std::
                vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
                end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                     *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_2d8 = __gnu_cxx::
                  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                  ::operator*(&local_2c8);
      local_2e0._M_node =
           (_Base_ptr)
           std::
           set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           ::find(in_stack_fffffffffffff488,(key_type *)in_stack_fffffffffffff480);
      local_2e8._M_node =
           (_Base_ptr)
           std::
           set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           ::end(in_stack_fffffffffffff478);
      bVar2 = std::operator!=(&local_2e0,&local_2e8);
      if (bVar2) {
        encode_utf8((UString *)in_stack_fffffffffffff498);
        std::operator+((char *)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        std::__cxx11::string::~string(local_328);
        uVar4 = __cxa_allocate_exception(0x60);
        StaticError::StaticError
                  (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                   (string *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
        __cxa_throw(uVar4,&StaticError::typeinfo,StaticError::~StaticError);
      }
      pVar6 = std::
              set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::insert((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)in_stack_fffffffffffff4a0,(value_type *)in_stack_fffffffffffff498);
      local_338 = (_Base_ptr)pVar6.first._M_node;
      local_330 = pVar6.second;
      pVar6 = std::
              set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::insert((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)in_stack_fffffffffffff4a0,(value_type *)in_stack_fffffffffffff498);
      local_348 = (_Base_ptr)pVar6.first._M_node;
      local_340 = pVar6.second;
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
      ::operator++(&local_2c8);
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),SUB81((ulong)in_RCX >> 0x38,0),
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    local_380 = (long)local_258 + 0x98;
    local_388._M_current =
         (ArgParam *)
         std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
         begin((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               in_stack_fffffffffffff478);
    local_390 = (ArgParam *)
                std::
                vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
                end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                     *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_398 = __gnu_cxx::
                  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                  ::operator*(&local_388);
      if (local_398->expr != (AST *)0x0) {
        static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                        SUB81((ulong)in_RCX >> 0x38,0),
                        (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
        append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               in_stack_fffffffffffff488);
        std::
        set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
        ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)0x2bcb9a);
      }
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
      ::operator++(&local_388);
    }
    local_3d0 = (long)local_258 + 0x98;
    local_3d8._M_current =
         (ArgParam *)
         std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
         begin((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
               in_stack_fffffffffffff478);
    local_3e0 = (ArgParam *)
                std::
                vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
                end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                     *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_3e8 = __gnu_cxx::
                  __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                  ::operator*(&local_3d8);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::erase((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)in_stack_fffffffffffff480,(key_type *)in_stack_fffffffffffff478);
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
      ::operator++(&local_3d8);
    }
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bccaf);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bccbc);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bccc9);
    break;
  case 0xd:
    if (in_RSI == (void *)0x0) {
      local_9f0 = 0;
    }
    else {
      local_9f0 = __dynamic_cast(in_RSI,&AST::typeinfo,&Import::typeinfo,0);
    }
    if (local_9f0 == 0) {
      __assert_fail("dynamic_cast<Import *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x6c,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 0xe:
    if (in_RSI == (void *)0x0) {
      local_a00 = 0;
    }
    else {
      local_a00 = __dynamic_cast(in_RSI,&AST::typeinfo,&Importstr::typeinfo,0);
    }
    if (local_a00 == 0) {
      __assert_fail("dynamic_cast<Importstr *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x70,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 0xf:
    if (in_RSI == (void *)0x0) {
      local_a10 = 0;
    }
    else {
      local_a10 = __dynamic_cast(in_RSI,&AST::typeinfo,&Importbin::typeinfo,0);
    }
    if (local_a10 == 0) {
      __assert_fail("dynamic_cast<Importbin *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x74,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 0x10:
    if (in_RSI == (void *)0x0) {
      local_a48 = 0;
    }
    else {
      local_a48 = __dynamic_cast(in_RSI,&AST::typeinfo,&Index::typeinfo,0);
    }
    if (local_a48 == 0) {
      __assert_fail("dynamic_cast<const Index *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x7f,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bd178);
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bd1cd);
    break;
  case 0x11:
    if (in_RSI == (void *)0x0) {
      local_a20 = 0;
    }
    else {
      local_a20 = __dynamic_cast(in_RSI,&AST::typeinfo,&InSuper::typeinfo,0);
    }
    if (local_a20 == 0) {
      __assert_fail("dynamic_cast<const InSuper *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x78,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if ((bVar1 & 1) == 0) {
      local_412 = 1;
      uVar4 = __cxa_allocate_exception(0x60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
      StaticError::StaticError
                (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                 (string *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
      local_412 = 0;
      __cxa_throw(uVar4,&StaticError::typeinfo,StaticError::~StaticError);
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bd06e);
    break;
  case 0x12:
    if (in_RSI == (void *)0x0) {
      local_a78 = 0;
    }
    else {
      local_a78 = __dynamic_cast(in_RSI,&AST::typeinfo,&LiteralBoolean::typeinfo,0);
    }
    if (local_a78 == 0) {
      __assert_fail("dynamic_cast<const LiteralBoolean *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x9a,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 0x13:
    if (in_RSI == (void *)0x0) {
      local_aa8 = 0;
    }
    else {
      local_aa8 = __dynamic_cast(in_RSI,&AST::typeinfo,&LiteralNull::typeinfo,0);
    }
    if (local_aa8 == 0) {
      __assert_fail("dynamic_cast<const LiteralNull *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xa6,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 0x14:
    if (in_RSI == (void *)0x0) {
      local_a88 = 0;
    }
    else {
      local_a88 = __dynamic_cast(in_RSI,&AST::typeinfo,&LiteralNumber::typeinfo,0);
    }
    if (local_a88 == 0) {
      __assert_fail("dynamic_cast<const LiteralNumber *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x9e,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 0x15:
    if (in_RSI == (void *)0x0) {
      local_a98 = 0;
    }
    else {
      local_a98 = __dynamic_cast(in_RSI,&AST::typeinfo,&LiteralString::typeinfo,0);
    }
    if (local_a98 == 0) {
      __assert_fail("dynamic_cast<const LiteralString *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xa2,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    break;
  case 0x16:
    if (in_RSI == (void *)0x0) {
      local_a58 = 0;
    }
    else {
      local_a58 = __dynamic_cast(in_RSI,&AST::typeinfo,&Local::typeinfo,0);
    }
    if (local_a58 == 0) {
      __assert_fail("dynamic_cast<const Local *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0x85,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_4b8 = in_RSI;
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           *)0x2bd2b5);
    local_4f0 = (long)local_4b8 + 0x80;
    local_4f8._M_current =
         (Bind *)std::
                 vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                 ::begin((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                          *)in_stack_fffffffffffff478);
    local_500 = (Bind *)std::
                        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                        ::end((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                               *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_508 = __gnu_cxx::
                  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                  ::operator*(&local_4f8);
      pVar6 = std::
              set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              ::insert((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                        *)in_stack_fffffffffffff4a0,(value_type *)in_stack_fffffffffffff498);
      local_518 = (_Base_ptr)pVar6.first._M_node;
      local_510 = pVar6.second;
      __gnu_cxx::
      __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
      ::operator++(&local_4f8);
    }
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           *)0x2bd3d6);
    local_580 = (long)local_4b8 + 0x80;
    local_588._M_current =
         (Bind *)std::
                 vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                 ::begin((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                          *)in_stack_fffffffffffff478);
    local_590 = (Bind *)std::
                        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                        ::end((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                               *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_598 = __gnu_cxx::
                  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                  ::operator*(&local_588);
      static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                      SUB81((ulong)in_RCX >> 0x38,0),
                      (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
      append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             in_stack_fffffffffffff488);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
              *)0x2bd49b);
      __gnu_cxx::
      __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
      ::operator++(&local_588);
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),SUB81((ulong)in_RCX >> 0x38,0),
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bd55a);
    local_600 = (long)local_4b8 + 0x80;
    local_608._M_current =
         (Bind *)std::
                 vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                 ::begin((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                          *)in_stack_fffffffffffff478);
    local_610 = (Bind *)std::
                        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                        ::end((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                               *)in_stack_fffffffffffff478);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                               *)in_stack_fffffffffffff480,
                              (__normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                               *)in_stack_fffffffffffff478), bVar2) {
      local_618 = __gnu_cxx::
                  __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
                  ::operator*(&local_608);
      std::
      set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::erase((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)in_stack_fffffffffffff480,(key_type *)in_stack_fffffffffffff478);
      __gnu_cxx::
      __normal_iterator<const_jsonnet::internal::Local::Bind_*,_std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>_>
      ::operator++(&local_608);
    }
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bd63d);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bd64a);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bd657);
    break;
  case 0x19:
    if (in_RSI == (void *)0x0) {
      local_ac8 = 0;
    }
    else {
      local_ac8 = __dynamic_cast(in_RSI,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo,0);
    }
    if (local_ac8 == 0) {
      __assert_fail("dynamic_cast<ObjectComprehensionSimple *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xb5,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
           *)in_stack_fffffffffffff480,in_stack_fffffffffffff478);
    pVar6 = std::
            set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            ::insert((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      *)in_stack_fffffffffffff4a0,(value_type *)in_stack_fffffffffffff498);
    local_738 = (_Base_ptr)pVar6.first._M_node;
    local_730 = pVar6.second;
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bdcb0);
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bdcff);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::erase((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
             *)in_stack_fffffffffffff480,(key_type *)in_stack_fffffffffffff478);
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bdd72);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2bdd7f);
    break;
  case 0x1b:
    if (in_RSI == (void *)0x0) {
      local_ae8 = 0;
    }
    else {
      local_ae8 = __dynamic_cast(in_RSI,&AST::typeinfo,&Self::typeinfo,0);
    }
    if (local_ae8 == 0) {
      __assert_fail("dynamic_cast<const Self *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xbf,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if ((bVar1 & 1) == 0) {
      local_7ea = 1;
      uVar4 = __cxa_allocate_exception(0x60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
      StaticError::StaticError
                (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                 (string *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
      local_7ea = 0;
      __cxa_throw(uVar4,&StaticError::typeinfo,StaticError::~StaticError);
    }
    break;
  case 0x1c:
    if (in_RSI == (void *)0x0) {
      local_b10 = 0;
    }
    else {
      local_b10 = __dynamic_cast(in_RSI,&AST::typeinfo,&SuperIndex::typeinfo,0);
    }
    if (local_b10 == 0) {
      __assert_fail("dynamic_cast<const SuperIndex *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xc4,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    if ((bVar1 & 1) == 0) {
      local_81a = 1;
      uVar4 = __cxa_allocate_exception(0x60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0);
      StaticError::StaticError
                (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,
                 (string *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
      local_81a = 0;
      __cxa_throw(uVar4,&StaticError::typeinfo,StaticError::~StaticError);
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2be180);
    break;
  case 0x1d:
    if (in_RSI == (void *)0x0) {
      local_b38 = 0;
    }
    else {
      local_b38 = __dynamic_cast(in_RSI,&AST::typeinfo,&Unary::typeinfo,0);
    }
    if (local_b38 == 0) {
      __assert_fail("dynamic_cast<const Unary *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xcb,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    static_analysis((AST *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(bool)in_object_00,
                    (IdSet *)CONCAT17(uVar7,in_stack_ffffffffffffffd8));
    append((IdSet *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
           in_stack_fffffffffffff488);
    std::
    set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::~set((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            *)0x2be27b);
    break;
  case 0x1e:
    if (in_RSI == (void *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(in_RSI,&AST::typeinfo,&Var::typeinfo,0);
    }
    if (lVar5 == 0) {
      __assert_fail("dynamic_cast<const Var *>(ast_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/static_analysis.cpp"
                    ,0xd0,"IdSet jsonnet::internal::static_analysis(AST *, bool, const IdSet &)");
    }
    local_898[0]._M_node =
         (_Base_ptr)
         std::
         set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         ::find(in_stack_fffffffffffff478,(key_type *)0x2be33a);
    local_8a0._M_node =
         (_Base_ptr)
         std::
         set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
         ::end(in_stack_fffffffffffff478);
    bVar2 = std::operator==(local_898,&local_8a0);
    if (bVar2) {
      local_8e1 = 1;
      this = (StaticError *)__cxa_allocate_exception(0x60);
      encode_utf8((UString *)in_stack_fffffffffffff498);
      std::operator+((char *)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
      StaticError::StaticError
                (this,in_stack_fffffffffffff498,
                 (string *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
      local_8e1 = 0;
      __cxa_throw(this,&StaticError::typeinfo,StaticError::~StaticError);
    }
    pVar6 = std::
            set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            ::insert((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                      *)in_stack_fffffffffffff4a0,(value_type *)in_stack_fffffffffffff498);
    local_8f8 = (_Base_ptr)pVar6.first._M_node;
    in_stack_fffffffffffff497 = pVar6.second;
    local_8f0 = in_stack_fffffffffffff497;
  }
  local_908[0]._M_node =
       (_Base_ptr)
       std::
       set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
       ::begin(in_stack_fffffffffffff478);
  local_910._M_node =
       (_Base_ptr)
       std::
       set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
       ::end(in_stack_fffffffffffff478);
  while (bVar2 = std::operator!=(local_908,&local_910), bVar2) {
    std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator*
              ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)0x2be57e);
    std::
    vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
    ::push_back((vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                 *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                (value_type *)in_stack_fffffffffffff488);
    std::_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*>::operator++
              ((_Rb_tree_const_iterator<const_jsonnet::internal::Identifier_*> *)
               in_stack_fffffffffffff480);
  }
  return in_RDI;
}

Assistant:

static IdSet static_analysis(AST *ast_, bool in_object, const IdSet &vars)
{
    IdSet r;

    switch (ast_->type) {
    case AST_APPLY: {
        assert(dynamic_cast<Apply *>(ast_));
        auto* ast = static_cast<Apply *>(ast_);
        append(r, static_analysis(ast->target, in_object, vars));
        for (const auto &arg : ast->args)
            append(r, static_analysis(arg.expr, in_object, vars));
    } break;
    case AST_APPLY_BRACE: {
        assert(dynamic_cast<ApplyBrace *>(ast_));
        // Nothing to do.
    } break;
    case AST_ARRAY: {
        assert(dynamic_cast<Array *>(ast_));
        auto* ast = static_cast<Array *>(ast_);
        for (auto &el : ast->elements)
            append(r, static_analysis(el.expr, in_object, vars));
    } break;
    case AST_BINARY: {
        assert(dynamic_cast<Binary *>(ast_));
        auto* ast = static_cast<Binary *>(ast_);
        append(r, static_analysis(ast->left, in_object, vars));
        append(r, static_analysis(ast->right, in_object, vars));
    } break;
    case AST_BUILTIN_FUNCTION: {
        assert(dynamic_cast<BuiltinFunction *>(ast_));
        // Nothing to do.
    } break;
    case AST_CONDITIONAL: {
        assert(dynamic_cast<Conditional *>(ast_));
        auto* ast = static_cast<Conditional *>(ast_);
        append(r, static_analysis(ast->cond, in_object, vars));
        append(r, static_analysis(ast->branchTrue, in_object, vars));
        append(r, static_analysis(ast->branchFalse, in_object, vars));
    } break;
    case AST_ERROR: {
        assert(dynamic_cast<Error *>(ast_));
        auto* ast = static_cast<Error *>(ast_);
        append(r, static_analysis(ast->expr, in_object, vars));
    } break;
    case AST_FUNCTION: {
        assert(dynamic_cast<Function *>(ast_));
        auto* ast = static_cast<Function *>(ast_);
        auto new_vars = vars;
        IdSet params;
        for (const auto &p : ast->params) {
            if (params.find(p.id) != params.end()) {
                std::string msg = "Duplicate function parameter: " + encode_utf8(p.id->name);
                throw StaticError(ast_->location, msg);
            }
            params.insert(p.id);
            new_vars.insert(p.id);
        }

        auto fv = static_analysis(ast->body, in_object, new_vars);
        for (const auto &p : ast->params) {
            if (p.expr != nullptr)
                append(fv, static_analysis(p.expr, in_object, new_vars));
        }
        for (const auto &p : ast->params)
            fv.erase(p.id);
        append(r, fv);
    } break;
    case AST_IMPORT: {
        assert(dynamic_cast<Import *>(ast_));
        // Nothing to do.
    } break;
    case AST_IMPORTSTR: {
        assert(dynamic_cast<Importstr *>(ast_));
        // Nothing to do.
    } break;
    case AST_IMPORTBIN: {
        assert(dynamic_cast<Importbin *>(ast_));
        // Nothing to do.
    } break;
    case AST_IN_SUPER: {
        assert(dynamic_cast<const InSuper *>(ast_));
        auto* ast = static_cast<const InSuper *>(ast_);
        if (!in_object)
            throw StaticError(ast_->location, "Can't use super outside of an object.");
        append(r, static_analysis(ast->element, in_object, vars));
    } break;
    case AST_INDEX: {
        assert(dynamic_cast<const Index *>(ast_));
        auto* ast = static_cast<const Index *>(ast_);
        append(r, static_analysis(ast->target, in_object, vars));
        append(r, static_analysis(ast->index, in_object, vars));
    } break;
    case AST_LOCAL: {
        assert(dynamic_cast<const Local *>(ast_));
        auto* ast = static_cast<const Local *>(ast_);
        IdSet ast_vars;
        for (const auto &bind : ast->binds) {
            ast_vars.insert(bind.var);
        }
        auto new_vars = vars;
        append(new_vars, ast_vars);
        IdSet fvs;
        for (const auto &bind : ast->binds) {
            append(fvs, static_analysis(bind.body, in_object, new_vars));
        }

        append(fvs, static_analysis(ast->body, in_object, new_vars));

        for (const auto &bind : ast->binds)
            fvs.erase(bind.var);

        append(r, fvs);
    } break;
    case AST_LITERAL_BOOLEAN: {
        assert(dynamic_cast<const LiteralBoolean *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_NUMBER: {
        assert(dynamic_cast<const LiteralNumber *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_STRING: {
        assert(dynamic_cast<const LiteralString *>(ast_));
        // Nothing to do.
    } break;
    case AST_LITERAL_NULL: {
        assert(dynamic_cast<const LiteralNull *>(ast_));
        // Nothing to do.
    } break;
    case AST_DESUGARED_OBJECT: {
        assert(dynamic_cast<DesugaredObject *>(ast_));
        auto* ast = static_cast<DesugaredObject *>(ast_);
        for (auto &field : ast->fields) {
            append(r, static_analysis(field.name, in_object, vars));
            append(r, static_analysis(field.body, true, vars));
        }
        for (AST *assert : ast->asserts) {
            append(r, static_analysis(assert, true, vars));
        }
    } break;
    case AST_OBJECT_COMPREHENSION_SIMPLE: {
        assert(dynamic_cast<ObjectComprehensionSimple *>(ast_));
        auto* ast = static_cast<ObjectComprehensionSimple *>(ast_);
        auto new_vars = vars;
        new_vars.insert(ast->id);
        append(r, static_analysis(ast->field, false, new_vars));
        append(r, static_analysis(ast->value, true, new_vars));
        r.erase(ast->id);
        append(r, static_analysis(ast->array, in_object, vars));
    } break;
    case AST_SELF: {
        assert(dynamic_cast<const Self *>(ast_));
        if (!in_object)
            throw StaticError(ast_->location, "Can't use self outside of an object.");
    } break;
    case AST_SUPER_INDEX: {
        assert(dynamic_cast<const SuperIndex *>(ast_));
        auto* ast = static_cast<const SuperIndex *>(ast_);
        if (!in_object)
            throw StaticError(ast_->location, "Can't use super outside of an object.");
        append(r, static_analysis(ast->index, in_object, vars));
    } break;
    case AST_UNARY: {
        assert(dynamic_cast<const Unary *>(ast_));
        auto* ast = static_cast<const Unary *>(ast_);
        append(r, static_analysis(ast->expr, in_object, vars));
    } break;
    case AST_VAR: {
        assert(dynamic_cast<const Var *>(ast_));
        auto* ast = static_cast<const Var *>(ast_);
        if (vars.find(ast->id) == vars.end()) {
            throw StaticError(ast->location, "Unknown variable: " + encode_utf8(ast->id->name));
        }
        r.insert(ast->id);
    } break;
    default:
        std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
        std::abort();
        break;
    }

    for (auto *id : r)
        ast_->freeVariables.push_back(id);

    return r;
}